

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O0

void get_max_rank_and_size(Am_Object *self,int *max_rank,int *max_size)

{
  int iVar1;
  Am_Value *pAVar2;
  undefined1 local_30 [8];
  Am_Value value;
  int *max_size_local;
  int *max_rank_local;
  Am_Object *self_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)max_size;
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(self,0x9c,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  if (local_30._0_2_ == 2) {
    iVar1 = Am_Value::operator_cast_to_int((Am_Value *)local_30);
    *max_rank = iVar1;
  }
  else {
    *max_rank = 0;
  }
  pAVar2 = Am_Object::Peek(self,0x9d,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  if (local_30._0_2_ == 2) {
    iVar1 = Am_Value::operator_cast_to_int((Am_Value *)local_30);
    *(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type =
         iVar1;
  }
  else {
    *(undefined4 *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type
         = 0;
  }
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void
get_max_rank_and_size(Am_Object self, int &max_rank, int &max_size)
{
  Am_Value value;
  value = self.Peek(Am_MAX_RANK);
  if (value.type == Am_INT)
    max_rank = value;
  else
    max_rank = 0;
  value = self.Peek(Am_MAX_SIZE);
  if (value.type == Am_INT)
    max_size = value;
  else
    max_size = 0;
}